

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O0

void av1_convert_model_to_params(double *params,WarpedMotionParams *model)

{
  TransformationType TVar1;
  WarpedMotionParams *in_RSI;
  int32_t *in_RDI;
  double *unaff_retaddr;
  
  convert_to_params(unaff_retaddr,in_RDI);
  TVar1 = get_wmtype(in_RSI);
  in_RSI->wmtype = TVar1;
  in_RSI->invalid = '\0';
  return;
}

Assistant:

void av1_convert_model_to_params(const double *params,
                                 WarpedMotionParams *model) {
  convert_to_params(params, model->wmmat);
  model->wmtype = get_wmtype(model);
  model->invalid = 0;
}